

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSSpeedGround.c
# Opt level: O1

int FANSSpeedGround_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  char *pcVar1;
  char *pcVar2;
  undefined4 uVar3;
  
  if (sptr == (void *)0x0) {
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar2 = td->name;
    uVar3 = 0x12;
    pcVar1 = "%s: value not given (%s:%d)";
    sptr = (void *)0x0;
  }
  else {
    if (*sptr - 7U < 0x40) {
      return 0;
    }
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar2 = td->name;
    uVar3 = 0x1e;
    pcVar1 = "%s: constraint failed (%s:%d)";
  }
  (*ctfailcb)(app_key,td,sptr,pcVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSSpeedGround.c"
              ,uVar3);
  return -1;
}

Assistant:

int
FANSSpeedGround_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	long value;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	value = *(const long *)sptr;
	
	if((value >= 7 && value <= 70)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}